

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O2

void __thiscall FParser::SF_TimedTip(FParser *this)

{
  float floatval;
  FFont *font;
  bool bVar1;
  int iVar2;
  FString local_20;
  
  bVar1 = CheckArgs(this,2);
  floatval = con_midtime.Value;
  if (bVar1) {
    iVar2 = intvalue(this->t_argv);
    FFloatCVar::operator=(&con_midtime,(float)iVar2 / 100.0);
    font = SmallFont;
    GetFormatString((FParser *)&stack0xffffffffffffffe0,(int)this);
    C_MidPrint(font,local_20.Chars);
    FString::~FString(&stack0xffffffffffffffe0);
    FFloatCVar::operator=(&con_midtime,floatval);
  }
  return;
}

Assistant:

void FParser::SF_TimedTip(void)
{
	if (CheckArgs(2))
	{
		float saved = con_midtime;
		con_midtime = intvalue(t_argv[0])/100.0f;
		C_MidPrint(SmallFont, GetFormatString(1).GetChars());
		con_midtime=saved;
	}
}